

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_zstd_read_fse(uchar **ppin,uchar *pinend,uint16_t *zdebug_table,int maxidx,
                     elf_zstd_fse_entry *table,int *table_bits)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint16_t uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint *puVar15;
  int table_size;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint *puVar19;
  ulong uVar20;
  bool bVar21;
  
  puVar15 = (uint *)*ppin;
  if (pinend <= (byte *)((long)puVar15 + 3U)) {
    return 0;
  }
  puVar19 = puVar15;
  if (((ulong)puVar15 & 3) == 0) {
    uVar17 = 0;
    uVar20 = 0;
  }
  else {
    uVar17 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 | (ulong)(byte)*puVar19 << ((byte)uVar17 & 0x3f);
      uVar17 = uVar17 + 8;
      puVar19 = (uint *)((long)puVar19 + 1);
      puVar15 = (uint *)((long)puVar15 + 1);
    } while (((ulong)puVar15 & 3) != 0);
    if (uVar17 != 8) goto LAB_00114f52;
  }
  if ((long)pinend - (long)puVar15 < 4) {
    return 0;
  }
  uVar20 = uVar20 | (ulong)*puVar19 << ((byte)uVar17 & 0x3f);
  uVar17 = (ulong)((uint)uVar17 | 0x20);
  puVar19 = puVar19 + 1;
LAB_00114f52:
  uVar6 = (uint)uVar20 & 0xf;
  iVar1 = uVar6 + 5;
  if (*table_bits < iVar1) {
    return 0;
  }
  *table_bits = iVar1;
  uVar18 = 0x20 << (sbyte)uVar6;
  if (-1 < maxidx) {
    uVar16 = (int)uVar17 - 4;
    uVar14 = uVar18 | 1;
    iVar7 = uVar6 + 6;
    uVar20 = uVar20 >> 4;
    bVar21 = false;
    uVar4 = 0;
    uVar17 = (ulong)uVar18;
    do {
      if (uVar16 < 0xf) {
        if ((long)pinend - (long)puVar19 < 4) {
          return 0;
        }
        uVar20 = uVar20 | (ulong)*puVar19 << ((byte)uVar16 & 0x3f);
        uVar16 = uVar16 | 0x20;
        puVar19 = puVar19 + 1;
      }
      uVar3 = (uint)uVar4;
      uVar6 = (uint)uVar20;
      uVar9 = uVar4;
      if (bVar21) {
        while ((~uVar6 & 0xfff) == 0) {
          uVar20 = uVar20 >> 0xc;
          uVar16 = uVar16 - 0xc;
          if (uVar16 < 0xf) {
            if ((long)pinend - (long)puVar19 < 4) {
              return 0;
            }
            uVar20 = uVar20 | (ulong)*puVar19 << ((byte)uVar16 & 0x3f);
            uVar16 = uVar16 | 0x20;
            puVar19 = puVar19 + 1;
          }
          uVar9 = (ulong)((int)uVar9 + 0x12);
          uVar6 = (uint)uVar20;
        }
        uVar6 = (uint)uVar20;
        while( true ) {
          uVar6 = uVar6 & 3;
          iVar13 = (int)uVar9;
          if (uVar6 != 3) break;
          uVar20 = uVar20 >> 2;
          uVar16 = uVar16 - 2;
          if (uVar16 < 0xf) {
            if ((long)pinend - (long)puVar19 < 4) {
              return 0;
            }
            uVar20 = uVar20 | (ulong)*puVar19 << ((byte)uVar16 & 0x3f);
            uVar16 = uVar16 | 0x20;
            puVar19 = puVar19 + 1;
          }
          uVar6 = (uint)uVar20;
          uVar9 = (ulong)(iVar13 + 3);
        }
        uVar11 = iVar13 + uVar6;
        if (maxidx < (int)uVar11) {
          return 0;
        }
        uVar20 = uVar20 >> 2;
        uVar16 = uVar16 - 2;
        if ((int)uVar3 < (int)uVar11) {
          memset(zdebug_table + (int)uVar3,0,(ulong)(~uVar3 + iVar13 + uVar6) * 2 + 2);
          bVar21 = false;
          uVar4 = (ulong)uVar11;
        }
        else {
          bVar21 = false;
        }
      }
      else {
        iVar13 = (int)uVar17;
        uVar12 = iVar13 * 2 - 1;
        uVar11 = uVar12 - uVar14;
        uVar8 = iVar13 - 1U & uVar6;
        if (uVar8 < uVar11) {
          iVar13 = iVar7 + -1;
        }
        else {
          uVar12 = uVar12 & uVar6;
          if ((int)uVar12 < iVar13) {
            uVar11 = 0;
          }
          uVar8 = uVar12 - uVar11;
          iVar13 = iVar7;
        }
        uVar16 = uVar16 - iVar13;
        uVar20 = uVar20 >> ((byte)iVar13 & 0x3f);
        iVar13 = 1 - uVar8;
        if ((int)uVar8 < 1) {
          iVar13 = -1;
        }
        uVar14 = uVar14 + iVar13;
        zdebug_table[(int)uVar3] = (uint16_t)(uVar8 - 1);
        uVar4 = (ulong)(uVar3 + 1);
        bVar21 = uVar8 - 1 == 0;
        for (; uVar14 < (uint)uVar17; uVar17 = (ulong)((uint)uVar17 >> 1)) {
          iVar7 = iVar7 + -1;
        }
      }
      iVar13 = (int)uVar4;
    } while ((1 < uVar14) && (iVar13 <= maxidx));
    if (uVar14 != 1) {
      return 0;
    }
    uVar6 = ~(uVar16 - 8 >> 3);
    if (uVar16 < 8) {
      uVar6 = 0;
    }
    *ppin = (byte *)((long)puVar19 + (long)(int)uVar6);
    if (iVar13 <= maxidx) {
      memset(zdebug_table + iVar13,0,(ulong)(uint)(maxidx - iVar13) * 2 + 2);
      uVar4 = (ulong)(maxidx + 1);
    }
    if (0 < (int)uVar4) {
      uVar17 = 0;
      uVar6 = uVar18 - 1;
      do {
        uVar10 = zdebug_table[uVar17];
        if ((short)uVar10 < 0) {
          table[(int)uVar6].symbol = (uchar)uVar17;
          uVar6 = uVar6 - 1;
          uVar10 = 1;
        }
        zdebug_table[uVar17 + 0x100] = uVar10;
        uVar17 = uVar17 + 1;
      } while (uVar4 != uVar17);
      uVar17 = 0;
      uVar14 = 0;
      do {
        uVar10 = zdebug_table[uVar17];
        if (0 < (short)uVar10) {
          iVar7 = 0;
          do {
            table[(int)uVar14].symbol = (uchar)uVar17;
            do {
              uVar14 = uVar14 + (uVar18 >> 3) + (uVar18 >> 1) + 3 & uVar18 - 1;
            } while ((int)uVar6 < (int)uVar14);
            iVar7 = iVar7 + 1;
          } while (iVar7 != (short)uVar10);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar4);
      if (uVar14 != 0) {
        return 0;
      }
    }
    uVar17 = 0;
    do {
      uVar2 = zdebug_table[(ulong)table[uVar17].symbol + 0x100];
      zdebug_table[(ulong)table[uVar17].symbol + 0x100] = uVar2 + 1;
      if (uVar2 == 0) {
        return 0;
      }
      iVar7 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      bVar5 = (char)iVar1 - (char)iVar7;
      table[uVar17].bits = bVar5;
      table[uVar17].base = (uVar2 << (bVar5 & 0x1f)) - (short)uVar18;
      uVar17 = uVar17 + 1;
    } while (uVar18 != uVar17);
    return 1;
  }
  return 0;
}

Assistant:

static int
elf_zstd_read_fse (const unsigned char **ppin, const unsigned char *pinend,
		   uint16_t *zdebug_table, int maxidx,
		   struct elf_zstd_fse_entry *table, int *table_bits)
{
  const unsigned char *pin;
  int16_t *norm;
  uint16_t *next;
  uint64_t val;
  unsigned int bits;
  int accuracy_log;
  uint32_t remaining;
  uint32_t threshold;
  int bits_needed;
  int idx;
  int prev0;

  pin = *ppin;

  norm = (int16_t *) zdebug_table;
  next = zdebug_table + 256;

  if (unlikely (pin + 3 >= pinend))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Align PIN to a 32-bit boundary.  */

  val = 0;
  bits = 0;
  while ((((uintptr_t) pin) & 3) != 0)
    {
      val |= (uint64_t)*pin << bits;
      bits += 8;
      ++pin;
    }

  if (!elf_fetch_bits (&pin, pinend, &val, &bits))
    return 0;

  accuracy_log = (val & 0xf) + 5;
  if (accuracy_log > *table_bits)
    {
      elf_uncompress_failed ();
      return 0;
    }
  *table_bits = accuracy_log;
  val >>= 4;
  bits -= 4;

  /* This code is mostly copied from the reference implementation.  */

  /* The number of remaining probabilities, plus 1.  This sets the number of
     bits that need to be read for the next value.  */
  remaining = (1 << accuracy_log) + 1;

  /* The current difference between small and large values, which depends on
     the number of remaining values.  Small values use one less bit.  */
  threshold = 1 << accuracy_log;

  /* The number of bits used to compute threshold.  */
  bits_needed = accuracy_log + 1;

  /* The next character value.  */
  idx = 0;

  /* Whether the last count was 0.  */
  prev0 = 0;

  while (remaining > 1 && idx <= maxidx)
    {
      uint32_t max;
      int32_t count;

      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
	return 0;

      if (prev0)
	{
	  int zidx;

	  /* Previous count was 0, so there is a 2-bit repeat flag.  If the
	     2-bit flag is 0b11, it adds 3 and then there is another repeat
	     flag.  */
	  zidx = idx;
	  while ((val & 0xfff) == 0xfff)
	    {
	      zidx += 3 * 6;
	      val >>= 12;
	      bits -= 12;
	      if  (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  while ((val & 3) == 3)
	    {
	      zidx += 3;
	      val >>= 2;
	      bits -= 2;
	      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  /* We have at least 13 bits here, don't need to fetch.  */
	  zidx += val & 3;
	  val >>= 2;
	  bits -= 2;

	  if (unlikely (zidx > maxidx))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  for (; idx < zidx; idx++)
	    norm[idx] = 0;

	  prev0 = 0;
	  continue;
	}

      max = (2 * threshold - 1) - remaining;
      if ((val & (threshold - 1)) < max)
	{
	  /* A small value.  */
	  count = (int32_t) ((uint32_t) val & (threshold - 1));
	  val >>= bits_needed - 1;
	  bits -= bits_needed - 1;
	}
      else
	{
	  /* A large value.  */
	  count = (int32_t) ((uint32_t) val & (2 * threshold - 1));
	  if (count >= (int32_t) threshold)
	    count -= (int32_t) max;
	  val >>= bits_needed;
	  bits -= bits_needed;
	}

      count--;
      if (count >= 0)
	remaining -= count;
      else
	remaining--;
      if (unlikely (idx >= 256))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
      norm[idx] = (int16_t) count;
      ++idx;

      prev0 = count == 0;

      while (remaining < threshold)
	{
	  bits_needed--;
	  threshold >>= 1;
	}
    }

  if (unlikely (remaining != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* If we've read ahead more than a byte, back up.  */
  while (bits >= 8)
    {
      --pin;
      bits -= 8;
    }

  *ppin = pin;

  for (; idx <= maxidx; idx++)
    norm[idx] = 0;

  return elf_zstd_build_fse (norm, idx, next, *table_bits, table);
}